

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::set_double_val(char *ext,double val)

{
  ushort uVar1;
  size_t i;
  size_t i_00;
  double dVar2;
  double local_38;
  
  uVar1 = *(ushort *)ext;
  dVar2 = -val;
  local_38 = dVar2;
  if (dVar2 <= val) {
    local_38 = val;
  }
  ext[4] = ext[4] & 0xf8U | val < dVar2;
  memset(ext + 5,0,(ulong)(uVar1 + 1 >> 1));
  dVar2 = log10(local_38);
  *(short *)(ext + 2) = (short)(int)dVar2 + 1;
  dVar2 = pow(10.0,(double)(int)dVar2);
  for (i_00 = 0; uVar1 != i_00; i_00 = i_00 + 1) {
    set_dig(ext,i_00,(int)(local_38 / dVar2));
    local_38 = local_38 - (double)(int)(local_38 / dVar2) * dVar2;
    dVar2 = dVar2 / 10.0;
  }
  normalize(ext);
  return;
}

Assistant:

void CVmObjBigNum::set_double_val(char *ext, double val)
{
    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the type to number */
    set_type(ext, VMBN_T_NUM);

    /* set the sign bit */
    if (val < 0)
    {
        set_neg(ext, TRUE);
        val = -val;
    }
    else
        set_neg(ext, FALSE);

    /* zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* 
     *   Initialize our exponent 'exp' to the integer portion of log10(val).
     *   If val is a power of 10, exp == log10(val) is an integer, and val is
     *   exactly one times 10^exp (e.g., if val is 1000, log10(val) == 3.0,
     *   and val == 1*10^3).  If val isn't a power of 10, 10^exp is the
     *   nearest power of 10 below val.  For example, log10(1500) == 3.176,
     *   so exp == int(log10(1500)) == 3, so val = 1.5*10^3.  In other words,
     *   the value can be represented as some number between 1 and 10 times
     *   10^exp.  Our storage format is close to this: we store the mantissa
     *   as a value between 0 and 1.  So what we *really* want for the
     *   exponent is log10(val)+1 - this will give us an exponent that we can
     *   multiply by some number between 0 and 1 to recreate 'val'.  
     */
    int exp = (int)log10(val) + 1;
    set_exp(ext, exp);

    /* 
     *   We know that val divided by 10^exp is between 0 and 1.  So the most
     *   significant digit of val is val/10^(exp-1).  We can then divide the
     *   remainder of that calculation by 10^(exp-2) to get the next digit,
     *   and the remainder of that by 10^(exp-3) for the next digit, and so
     *   on.  Keep going until we've filled out our digits.
     */
    double base = pow(10.0, exp - 1);
    for (size_t i = 0 ; i < prec ; ++i, base /= 10.0)
    {
        /* 
         *   get the most significant remaining digit by dividing by the
         *   log10 exponent of the current value 
         */
        int dig = (int)(val / base);
        set_dig(ext, i, dig);

        /* get the remainder */
        val -= dig*base;
    }

    /* normalize the number */
    normalize(ext);
}